

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

void __thiscall
perfetto::TracingServiceImpl::EmitStats
          (TracingServiceImpl *this,TracingSession *tracing_session,
          vector<perfetto::TracePacket,_std::allocator<perfetto::TracePacket>_> *packets)

{
  RootMessage<perfetto::protos::pbzero::TracePacket> *this_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> packet_00;
  Message *msg;
  HeapBuffered<perfetto::protos::pbzero::TracePacket> packet;
  vector<perfetto::TracePacket,_std::allocator<perfetto::TracePacket>_> *in_stack_fffffffffffffe58;
  pointer in_stack_fffffffffffffe60;
  pointer in_stack_fffffffffffffe68;
  HeapBuffered<perfetto::protos::pbzero::TracePacket> local_190;
  TraceStats local_d0;
  
  protozero::HeapBuffered<perfetto::protos::pbzero::TracePacket>::HeapBuffered
            (&local_190,0x1000,0x1000);
  this_00 = &local_190.msg_;
  protozero::Message::AppendVarInt<int>((Message *)this_00,3,this->uid_);
  protozero::Message::AppendVarInt<unsigned_int>((Message *)this_00,10,1);
  GetTraceStats(&local_d0,this,tracing_session);
  msg = protozero::Message::BeginNestedMessageInternal((Message *)this_00,0x23);
  protos::gen::TraceStats::Serialize(&local_d0,msg);
  protos::gen::TraceStats::~TraceStats(&local_d0);
  protozero::Message::Finalize((Message *)this_00);
  protozero::ScatteredHeapBuffer::StitchSlices
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&stack0xfffffffffffffe58,
             &local_190.shb_);
  packet_00.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = in_stack_fffffffffffffe60;
  packet_00.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffe58;
  packet_00.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffffe68;
  anon_unknown_4::SerializeAndAppendPacket
            ((anon_unknown_4 *)packets,in_stack_fffffffffffffe58,packet_00);
  if (in_stack_fffffffffffffe58 !=
      (vector<perfetto::TracePacket,_std::allocator<perfetto::TracePacket>_> *)0x0) {
    operator_delete(in_stack_fffffffffffffe58,
                    (long)in_stack_fffffffffffffe68 - (long)in_stack_fffffffffffffe58);
  }
  protozero::MessageArena::~MessageArena(&local_190.msg_.root_arena_);
  protozero::ScatteredStreamWriter::~ScatteredStreamWriter(&local_190.writer_);
  protozero::ScatteredHeapBuffer::~ScatteredHeapBuffer(&local_190.shb_);
  return;
}

Assistant:

void TracingServiceImpl::EmitStats(TracingSession* tracing_session,
                                   std::vector<TracePacket>* packets) {
  protozero::HeapBuffered<protos::pbzero::TracePacket> packet;
  packet->set_trusted_uid(static_cast<int32_t>(uid_));
  packet->set_trusted_packet_sequence_id(kServicePacketSequenceID);
  GetTraceStats(tracing_session).Serialize(packet->set_trace_stats());
  SerializeAndAppendPacket(packets, packet.SerializeAsArray());
}